

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O2

void __thiscall QpVector::resparsify(QpVector *this)

{
  double dVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  HighsInt i;
  long lVar5;
  
  this->num_nz = 0;
  piVar3 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar5 < this->dim; lVar5 = lVar5 + 1) {
    dVar1 = pdVar4[lVar5];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar2 = this->num_nz;
      this->num_nz = iVar2 + 1;
      piVar3[iVar2] = (int)lVar5;
    }
  }
  return;
}

Assistant:

void resparsify() {
    num_nz = 0;
    for (HighsInt i = 0; i < dim; i++) {
      if (value[i] != 0.0) {
        index[num_nz++] = i;
      }
    }
  }